

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::IsOff(char *val)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  char *unaff_retaddr;
  char *pcStack_8;
  
  if (val == (char *)0x0) {
    return true;
  }
  cVar1 = *val;
  switch(cVar1) {
  case 'F':
switchD_0014bb52_caseD_66:
    if ((((byte)(val[1] | 0x20U) == 0x61) && ((byte)(val[2] | 0x20U) == 0x6c)) &&
       (((byte)(val[3] | 0x20U) == 0x73 && (((byte)(val[4] | 0x20U) == 0x65 && (val[5] == '\0'))))))
    {
      return true;
    }
    if (cVar1 != 'I') goto code_r0x0014bafa;
    break;
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'L':
  case 'M':
switchD_0014bb52_caseD_67:
    bVar3 = IsNOTFOUND(unaff_retaddr);
    return bVar3;
  case 'I':
    break;
  case 'N':
switchD_0014bb52_caseD_6e:
    cVar2 = val[1];
    if (cVar2 == '\0') {
      return true;
    }
    if (((cVar2 == 'o') || (cVar2 == 'O')) && (val[2] == '\0')) {
      return true;
    }
    if (cVar1 != 'i') {
      if (cVar1 != 'f') goto code_r0x0014bafa;
      goto switchD_0014bb52_caseD_66;
    }
    break;
  case 'O':
switchD_0014bb52_caseD_6f:
    if ((((byte)(val[1] | 0x20U) == 0x66) && ((byte)(val[2] | 0x20U) == 0x66)) && (val[3] == '\0'))
    {
      return true;
    }
    if (cVar1 == 'f') goto switchD_0014bb52_caseD_66;
    if (cVar1 != 'i') {
      if (cVar1 != 'n') goto code_r0x0014bafa;
      goto switchD_0014bb52_caseD_6e;
    }
    break;
  default:
    switch(cVar1) {
    case 'f':
      goto switchD_0014bb52_caseD_66;
    case 'g':
    case 'h':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
      goto switchD_0014bb52_caseD_67;
    case 'i':
      break;
    case 'n':
      goto switchD_0014bb52_caseD_6e;
    case 'o':
      goto switchD_0014bb52_caseD_6f;
    default:
      if (cVar1 == '\0') {
        return true;
      }
      if ((cVar1 == '0') && (val[1] == '\0')) {
        return true;
      }
      goto code_r0x0014bafa;
    }
  }
  if ((((((byte)(val[1] | 0x20U) == 0x67) && ((byte)(val[2] | 0x20U) == 0x6e)) &&
       ((byte)(val[3] | 0x20U) == 0x6f)) &&
      (((byte)(val[4] | 0x20U) == 0x72 && ((byte)(val[5] | 0x20U) == 0x65)))) && (val[6] == '\0')) {
    return true;
  }
code_r0x0014bafa:
  pcStack_8 = val;
  iVar4 = strcmp(val,"NOTFOUND");
  if (iVar4 == 0) {
    bVar3 = true;
  }
  else {
    bVar3 = cmHasLiteralSuffix<char_const*,10ul>(&pcStack_8,(char (*) [10])0x410a9f);
  }
  return bVar3;
}

Assistant:

bool cmSystemTools::IsOff(const char* val)
{
  // ""
  if (!val || val[0] == '\0') {
    return true;
  }
  /* clang-format off */
  // "0"
  if (val[0] == '0' && val[1] == '\0') {
    return true;
  }
  // "OFF"
  if ((val[0] == 'O' || val[0] == 'o') &&
      (val[1] == 'F' || val[1] == 'f') &&
      (val[2] == 'F' || val[2] == 'f') && val[3] == '\0') {
    return true;
  }
  // "N", "NO"
  if ((val[0] == 'N' || val[0] == 'n') && (val[1] == '\0' || (
      (val[1] == 'O' || val[1] == 'o') && val[2] == '\0'))) {
    return true;
  }
  // "FALSE"
  if ((val[0] == 'F' || val[0] == 'f') &&
      (val[1] == 'A' || val[1] == 'a') &&
      (val[2] == 'L' || val[2] == 'l') &&
      (val[3] == 'S' || val[3] == 's') &&
      (val[4] == 'E' || val[4] == 'e') && val[5] == '\0') {
    return true;
  }
  // "IGNORE"
  if ((val[0] == 'I' || val[0] == 'i') &&
      (val[1] == 'G' || val[1] == 'g') &&
      (val[2] == 'N' || val[2] == 'n') &&
      (val[3] == 'O' || val[3] == 'o') &&
      (val[4] == 'R' || val[4] == 'r') &&
      (val[5] == 'E' || val[5] == 'e') && val[6] == '\0') {
    return true;
  }
  /* clang-format on */
  return cmSystemTools::IsNOTFOUND(val);
}